

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O0

vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> * __thiscall
dg::vr::StructureAnalyzer::getRelevantConditions(StructureAnalyzer *this,VRAssumeBool *assume)

{
  initializer_list<const_llvm::ICmpInst_*> __l;
  initializer_list<const_llvm::PHINode_*> __l_00;
  bool bVar1;
  reference ppPVar2;
  VRInstruction *this_00;
  ret_type pIVar3;
  ret_type pPVar4;
  VRAssumeBool *in_RDX;
  vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_> *in_RSI;
  Value *in_RDI;
  PHINode *phi_2;
  ICmpInst *icmp_1;
  Instruction *inst;
  VREdge *sourceEdge;
  iterator __end3;
  iterator __begin3;
  vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_> *__range3;
  PHINode *phi_1;
  vector<const_llvm::PHINode_*,_std::allocator<const_llvm::PHINode_*>_> to_process;
  vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> result;
  PHINode *phi;
  ICmpInst *icmp;
  value_type in_stack_fffffffffffffee8;
  Value *__a;
  iterator in_stack_ffffffffffffff08;
  size_type in_stack_ffffffffffffff10;
  int local_d4;
  __normal_iterator<const_dg::vr::VREdge_**,_std::vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>_>
  local_c8;
  StructureAnalyzer local_c0 [15];
  undefined1 in_stack_ffffffffffffff4f;
  PHINode *in_stack_ffffffffffffff50;
  StructureAnalyzer *in_stack_ffffffffffffff58;
  ret_type local_90;
  ret_type *local_88;
  undefined8 local_80;
  ret_type local_48;
  ret_type local_38;
  ret_type *local_30;
  undefined8 local_28;
  ret_type local_20;
  VRAssumeBool *local_18;
  
  __a = in_RDI;
  local_18 = in_RDX;
  VRAssume::getValue(&in_RDX->super_VRAssume);
  local_38 = llvm::dyn_cast<llvm::ICmpInst,llvm::Value_const>(in_RDI);
  local_20 = local_38;
  if (local_38 == (ret_type)0x0) {
    VRAssume::getValue(&local_18->super_VRAssume);
    local_48 = llvm::dyn_cast<llvm::PHINode,llvm::Value_const>(in_RDI);
    if (local_48 == (ret_type)0x0) {
      memset(in_RDI,0,0x18);
      std::vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>::vector
                ((vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> *)0x1f10e1
                );
    }
    else {
      std::vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>::vector
                ((vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> *)0x1f10f3
                );
      local_90 = local_48;
      local_88 = &local_90;
      local_80 = 1;
      std::allocator<const_llvm::PHINode_*>::allocator((allocator<const_llvm::PHINode_*> *)0x1f112c)
      ;
      __l_00._M_len = in_stack_ffffffffffffff10;
      __l_00._M_array = (iterator)in_stack_ffffffffffffff08;
      std::vector<const_llvm::PHINode_*,_std::allocator<const_llvm::PHINode_*>_>::vector
                ((vector<const_llvm::PHINode_*,_std::allocator<const_llvm::PHINode_*>_> *)in_RSI,
                 __l_00,(allocator_type *)__a);
      std::allocator<const_llvm::PHINode_*>::~allocator
                ((allocator<const_llvm::PHINode_*> *)0x1f115e);
      do {
        bVar1 = std::vector<const_llvm::PHINode_*,_std::allocator<const_llvm::PHINode_*>_>::empty
                          ((vector<const_llvm::PHINode_*,_std::allocator<const_llvm::PHINode_*>_> *)
                           in_RSI);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          std::vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>::vector
                    ((vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> *)
                     in_RDI,(vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>
                             *)in_stack_fffffffffffffee8);
          break;
        }
        ppPVar2 = std::vector<const_llvm::PHINode_*,_std::allocator<const_llvm::PHINode_*>_>::back
                            ((vector<const_llvm::PHINode_*,_std::allocator<const_llvm::PHINode_*>_>
                              *)in_RDI);
        in_stack_fffffffffffffee8 = *ppPVar2;
        std::vector<const_llvm::PHINode_*,_std::allocator<const_llvm::PHINode_*>_>::pop_back
                  ((vector<const_llvm::PHINode_*,_std::allocator<const_llvm::PHINode_*>_> *)0x1f1198
                  );
        VRAssumeBool::getAssumption(local_18);
        possibleSources(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                        (bool)in_stack_ffffffffffffff4f);
        in_stack_ffffffffffffff58 = local_c0;
        local_c8._M_current =
             (VREdge **)
             std::vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>::begin
                       ((vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_> *)
                        in_stack_fffffffffffffee8);
        std::vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>::end
                  ((vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_> *)
                   in_stack_fffffffffffffee8);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_dg::vr::VREdge_**,_std::vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>_>
                                   *)in_RDI,
                                  (__normal_iterator<const_dg::vr::VREdge_**,_std::vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>_>
                                   *)in_stack_fffffffffffffee8), bVar1) {
          __gnu_cxx::
          __normal_iterator<const_dg::vr::VREdge_**,_std::vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>_>
          ::operator*(&local_c8);
          this_00 = (VRInstruction *)
                    std::unique_ptr<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_>::get
                              ((unique_ptr<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_> *)
                               0x1f122f);
          VRInstruction::getInstruction(this_00);
          pIVar3 = llvm::dyn_cast<llvm::ICmpInst,llvm::Instruction_const>((Instruction *)in_RDI);
          if (pIVar3 == (ret_type)0x0) {
            pPVar4 = llvm::dyn_cast<llvm::PHINode,llvm::Instruction_const>((Instruction *)in_RDI);
            if (pPVar4 == (ret_type)0x0) {
              memset(in_RDI,0,0x18);
              std::vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>::vector
                        ((vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> *)
                         0x1f12ad);
              local_d4 = 1;
              goto LAB_001f12ca;
            }
            std::vector<llvm::PHINode_const*,std::allocator<llvm::PHINode_const*>>::
            emplace_back<llvm::PHINode_const*&>
                      ((vector<const_llvm::PHINode_*,_std::allocator<const_llvm::PHINode_*>_> *)
                       in_RSI,(PHINode **)__a);
          }
          else {
            std::vector<llvm::ICmpInst_const*,std::allocator<llvm::ICmpInst_const*>>::
            emplace_back<llvm::ICmpInst_const*&>
                      ((vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> *)
                       in_RSI,(ICmpInst **)__a);
          }
          __gnu_cxx::
          __normal_iterator<const_dg::vr::VREdge_**,_std::vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>_>
          ::operator++(&local_c8);
        }
        local_d4 = 4;
LAB_001f12ca:
        std::vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>::~vector
                  (in_RSI);
      } while (local_d4 == 4);
      std::vector<const_llvm::PHINode_*,_std::allocator<const_llvm::PHINode_*>_>::~vector
                ((vector<const_llvm::PHINode_*,_std::allocator<const_llvm::PHINode_*>_> *)in_RSI);
      std::vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>::~vector
                ((vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> *)in_RSI);
    }
  }
  else {
    local_30 = &local_38;
    local_28 = 1;
    std::allocator<const_llvm::ICmpInst_*>::allocator((allocator<const_llvm::ICmpInst_*> *)0x1f106a)
    ;
    __l._M_len = in_stack_ffffffffffffff10;
    __l._M_array = in_stack_ffffffffffffff08;
    std::vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>::vector
              ((vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> *)in_RSI,__l
               ,(allocator_type *)__a);
    std::allocator<const_llvm::ICmpInst_*>::~allocator
              ((allocator<const_llvm::ICmpInst_*> *)0x1f1099);
  }
  return (vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> *)__a;
}

Assistant:

std::vector<const llvm::ICmpInst *>
StructureAnalyzer::getRelevantConditions(const VRAssumeBool *assume) const {
    if (const auto *icmp = llvm::dyn_cast<llvm::ICmpInst>(assume->getValue()))
        return {icmp};

    const auto *phi = llvm::dyn_cast<llvm::PHINode>(assume->getValue());
    if (!phi)
        return {};

    std::vector<const llvm::ICmpInst *> result;
    std::vector<const llvm::PHINode *> to_process{phi};

    while (!to_process.empty()) {
        const auto *phi = to_process.back();
        to_process.pop_back();

        for (const auto *sourceEdge :
             possibleSources(phi, assume->getAssumption())) {
            assert(sourceEdge->op->isInstruction());
            const llvm::Instruction *inst =
                    static_cast<const VRInstruction *>(sourceEdge->op.get())
                            ->getInstruction();
            if (const auto *icmp = llvm::dyn_cast<llvm::ICmpInst>(inst))
                result.emplace_back(icmp);
            else if (const auto *phi = llvm::dyn_cast<llvm::PHINode>(inst))
                to_process.emplace_back(phi);
            else
                return {};
        }
    }
    return result;
}